

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

void __thiscall
wabt::interp::DefinedFunc::DefinedFunc(DefinedFunc *this,Store *store,Ref instance,FuncDesc *desc)

{
  ValueTypes *__x;
  ValueTypes *__x_00;
  FuncType local_70;
  
  local_70.super_ExternType.kind = (desc->type).super_ExternType.kind;
  local_70.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001f08b0;
  __x = &(desc->type).params;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_70.params,__x);
  __x_00 = &(desc->type).results;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_70.results,__x_00);
  Func::Func(&this->super_Func,DefinedFunc,&local_70);
  local_70.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001f08b0;
  if (local_70.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_Func).super_Extern.super_Object._vptr_Object =
       (_func_int **)&PTR__DefinedFunc_001f06a8;
  (this->instance_).index = instance.index;
  (this->desc_).type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001f0580;
  (this->desc_).type.super_ExternType.kind = (desc->type).super_ExternType.kind;
  (this->desc_).type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001f08b0;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&(this->desc_).type.params,__x);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&(this->desc_).type.results,__x_00);
  std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
            (&(this->desc_).locals,&desc->locals);
  (this->desc_).code_offset = desc->code_offset;
  return;
}

Assistant:

DefinedFunc::DefinedFunc(Store& store, Ref instance, FuncDesc desc)
    : Func(skind, desc.type), instance_(instance), desc_(desc) {}